

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O2

int mac_method_hmac_md5_hash
              (LIBSSH2_SESSION *session,uchar *buf,uint32_t seqno,uchar *packet,uint32_t packet_len,
              uchar *addtl,uint32_t addtl_len,void **abstract)

{
  void *key;
  HMAC_CTX *ctx;
  EVP_MD *md;
  uchar seqno_buf [4];
  
  _libssh2_htonu32(seqno_buf,seqno);
  ctx = (HMAC_CTX *)HMAC_CTX_new();
  key = *abstract;
  md = EVP_md5();
  HMAC_Init_ex(ctx,key,0x10,md,(ENGINE *)0x0);
  HMAC_Update(ctx,seqno_buf,4);
  HMAC_Update(ctx,packet,(ulong)packet_len);
  if (addtl_len != 0 && addtl != (uchar *)0x0) {
    HMAC_Update(ctx,addtl,(ulong)addtl_len);
  }
  HMAC_Final(ctx,buf,(uint *)0x0);
  HMAC_CTX_free(ctx);
  return 0;
}

Assistant:

static int
mac_method_hmac_md5_hash(LIBSSH2_SESSION * session, unsigned char *buf,
                         uint32_t seqno,
                         const unsigned char *packet,
                         uint32_t packet_len,
                         const unsigned char *addtl,
                         uint32_t addtl_len, void **abstract)
{
    libssh2_hmac_ctx ctx;
    unsigned char seqno_buf[4];
    (void) session;

    _libssh2_htonu32(seqno_buf, seqno);

    libssh2_hmac_ctx_init(ctx);
    libssh2_hmac_md5_init(&ctx, *abstract, 16);
    libssh2_hmac_update(ctx, seqno_buf, 4);
    libssh2_hmac_update(ctx, packet, packet_len);
    if (addtl && addtl_len) {
        libssh2_hmac_update(ctx, addtl, addtl_len);
    }
    libssh2_hmac_final(ctx, buf);
    libssh2_hmac_cleanup(&ctx);

    return 0;
}